

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::Texture3DLodControlCase::iterate(Texture3DLodControlCase *this)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  Texture3D *this_00;
  undefined4 extraout_var_00;
  char *pcVar8;
  reference pvVar9;
  RenderTarget *this_01;
  PixelFormat *format;
  Texture3D *this_02;
  qpWatchDog *watchDog;
  TestLog *pTVar10;
  MessageBuilder *pMVar11;
  Texture3DView TVar12;
  int local_95c;
  int local_958;
  bool local_951;
  int local_924;
  int local_920;
  allocator<char> local_8e9;
  undefined1 local_8e8 [6];
  bool isOk;
  allocator<char> local_8c1;
  string local_8c0;
  LogImage local_8a0;
  allocator<char> local_809;
  string local_808;
  allocator<char> local_7e1;
  string local_7e0;
  LogImage local_7c0;
  allocator<char> local_729;
  string local_728;
  allocator<char> local_701;
  string local_700;
  LogImage local_6e0;
  allocator<char> local_649;
  string local_648;
  allocator<char> local_621;
  string local_620;
  LogImageSet local_600;
  MessageBuilder local_5c0;
  Texture3DView local_440;
  PixelBufferAccess local_430;
  PixelBufferAccess local_408;
  PixelBufferAccess local_3e0;
  ConstPixelBufferAccess local_3b8;
  PixelBufferAccess local_390;
  ConstPixelBufferAccess local_368;
  Texture3DView local_340;
  SurfaceAccess local_330;
  uint local_310;
  int local_30c;
  int cellNdx_1;
  int curH_1;
  int curW_1;
  int curY_1;
  int curX_1;
  int gridX_1;
  int gridY_1;
  Vector<int,_4> local_2e0;
  Vector<int,_4> local_2d0;
  IVec4 local_2c0;
  tcu local_2b0 [8];
  float afStack_2a8 [2];
  Vector<int,_3> local_2a0;
  Vector<int,_3> local_294;
  int local_288;
  undefined1 local_284 [4];
  int numFailedPixels;
  LodPrecision lodPrec;
  LookupPrecision lookupPrec;
  Surface errorMask;
  Surface referenceFrame;
  bool isTrilinear;
  PixelFormat *pixelFormat;
  uint local_1dc;
  int local_1d8;
  int cellNdx;
  int curH;
  int curW;
  int curY;
  int curX;
  int gridX;
  int gridY;
  Sampler local_1b8;
  undefined1 local_16c [8];
  ReferenceParams sampleParams;
  vector<float,_std::allocator<float>_> texCoord;
  Surface renderedFrame;
  int cellHeight;
  int cellWidth;
  int gridHeight;
  int gridWidth;
  RandomViewport viewport;
  RenderTarget *renderTarget;
  int texHeight;
  int texWidth;
  TextureFormatInfo fmtInfo;
  TextureFormat *texFmt;
  Texture3D *refTexture;
  deUint32 magFilter;
  deUint32 wrapR;
  deUint32 wrapT;
  deUint32 wrapS;
  Functions *gl;
  Texture3DLodControlCase *this_local;
  long lVar7;
  
  pRVar6 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar2);
  this_00 = glu::Texture3D::getRefTexture(this->m_texture);
  fmtInfo.lookupBias.m_data._8_8_ =
       tcu::TextureLevelPyramid::getFormat(&this_00->super_TextureLevelPyramid);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&texHeight,(TextureFormat *)fmtInfo.lookupBias.m_data._8_8_);
  iVar2 = tcu::Texture3D::getWidth(this_00);
  iVar3 = tcu::Texture3D::getHeight(this_00);
  pRVar6 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[4])();
  viewport._8_8_ = (RenderTarget *)CONCAT44(extraout_var_00,iVar4);
  pcVar8 = tcu::TestNode::getName((TestNode *)this);
  dVar5 = deStringHash(pcVar8);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&gridHeight,(RenderTarget *)CONCAT44(extraout_var_00,iVar4),
             iVar2 << 2,iVar3 << 2,dVar5);
  iVar2 = viewport.x;
  if (viewport.x < 0) {
    iVar2 = viewport.x + 3;
  }
  iVar2 = iVar2 >> 2;
  iVar3 = viewport.y;
  if (viewport.y < 0) {
    iVar3 = viewport.y + 3;
  }
  iVar3 = iVar3 >> 2;
  tcu::Surface::Surface
            ((Surface *)
             &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,viewport.x,viewport.y);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&sampleParams.baseLevel);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_16c,TEXTURETYPE_3D);
  glu::mapGLSampler(&local_1b8,0x812f,0x812f,0x812f,this->m_minFilter,0x2600);
  tcu::Sampler::operator=
            ((Sampler *)(sampleParams.super_RenderParams.colorBias.m_data + 2),&local_1b8);
  _gridX = *(TextureFormat *)fmtInfo.lookupBias.m_data._8_8_;
  local_16c._4_4_ = glu::TextureTestUtil::getSamplerType(_gridX);
  sampleParams.super_RenderParams.colorScale.m_data[2] = fmtInfo.lookupScale.m_data[2];
  sampleParams.super_RenderParams.colorScale.m_data[3] = fmtInfo.lookupScale.m_data[3];
  sampleParams.super_RenderParams.colorBias.m_data[0] = fmtInfo.lookupBias.m_data[0];
  sampleParams.super_RenderParams.colorBias.m_data[1] = fmtInfo.lookupBias.m_data[1];
  sampleParams.super_RenderParams.bias = fmtInfo.valueMax.m_data[2];
  sampleParams.super_RenderParams.ref = fmtInfo.valueMax.m_data[3];
  sampleParams.super_RenderParams.colorScale.m_data[0] = fmtInfo.lookupScale.m_data[0];
  sampleParams.super_RenderParams.colorScale.m_data[1] = fmtInfo.lookupScale.m_data[1];
  pcVar1 = *(code **)(lVar7 + 0xb8);
  dVar5 = glu::Texture3D::getGLTexture(this->m_texture);
  (*pcVar1)(0x806f,dVar5);
  (**(code **)(lVar7 + 0x1360))(0x806f,0x2802,0x812f);
  (**(code **)(lVar7 + 0x1360))(0x806f,0x2803,0x812f);
  (**(code **)(lVar7 + 0x1360))(0x806f,0x8072,0x812f);
  (**(code **)(lVar7 + 0x1360))(0x806f,0x2801,this->m_minFilter);
  (**(code **)(lVar7 + 0x1360))(0x806f,0x2800,0x2600);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureMipmapTests.cpp"
                  ,0x86c);
  for (curX = 0; curX < 4; curX = curX + 1) {
    for (curY = 0; curY < 4; curY = curY + 1) {
      curW = iVar2 * curY;
      curH = iVar3 * curX;
      local_920 = iVar2;
      if (curY == 3) {
        local_920 = viewport.x - curW;
      }
      cellNdx = local_920;
      local_924 = iVar3;
      if (curX == 3) {
        local_924 = viewport.y - curH;
      }
      local_1d8 = local_924;
      local_1dc = curY + curX * 4;
      getBasicTexCoord3D((vector<float,_std::allocator<float>_> *)&sampleParams.baseLevel,local_1dc)
      ;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                (this,(ulong)local_1dc);
      (**(code **)(lVar7 + 0x1a00))(gridHeight + curW,gridWidth + curH,cellNdx,local_1d8);
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&sampleParams.baseLevel,0);
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (&this->m_renderer,0,pvVar9,(RenderParams *)local_16c);
    }
  }
  pRVar6 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess
            ((PixelBufferAccess *)&pixelFormat,
             (Surface *)
             &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  glu::readPixels(pRVar6,gridHeight,gridWidth,(PixelBufferAccess *)&pixelFormat);
  this_01 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  format = tcu::RenderTarget::getPixelFormat(this_01);
  local_951 = true;
  if (this->m_minFilter != 0x2702) {
    local_951 = this->m_minFilter == 0x2703;
  }
  tcu::Surface::Surface((Surface *)&errorMask.m_pixels.m_cap,viewport.x,viewport.y);
  tcu::Surface::Surface((Surface *)&lookupPrec.colorMask,viewport.x,viewport.y);
  tcu::LookupPrecision::LookupPrecision((LookupPrecision *)&lodPrec.derivateBits);
  tcu::LodPrecision::LodPrecision((LodPrecision *)local_284,RULE_OPENGL);
  local_288 = 0;
  tcu::Vector<int,_3>::Vector(&local_294,0x14,0x14,0x14);
  lookupPrec.coordBits.m_data[0] = local_294.m_data[2];
  lodPrec.derivateBits = local_294.m_data[0];
  lodPrec.lodBits = local_294.m_data[1];
  tcu::Vector<int,_3>::Vector(&local_2a0,0x10,0x10,0x10);
  lookupPrec.uvwBits.m_data[0] = local_2a0.m_data[2];
  lookupPrec.coordBits.m_data[1] = local_2a0.m_data[0];
  lookupPrec.coordBits.m_data[2] = local_2a0.m_data[1];
  glu::TextureTestUtil::getBitsVec((TextureTestUtil *)&local_2e0,format);
  tcu::operator-((tcu *)&local_2d0,&local_2e0,local_951 + 1);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&gridY_1,0);
  tcu::max<int,4>((tcu *)&local_2c0,&local_2d0,(Vector<int,_4> *)&gridY_1);
  tcu::computeFixedPointThreshold(local_2b0,&local_2c0);
  lookupPrec.uvwBits.m_data._4_8_ = local_2b0;
  lookupPrec.colorThreshold.m_data[0] = afStack_2a8[0];
  lookupPrec.colorThreshold.m_data[1] = afStack_2a8[1];
  glu::TextureTestUtil::getCompareMask((TextureTestUtil *)&gridX_1,format);
  lookupPrec.colorThreshold.m_data[2] = (float)gridX_1;
  numFailedPixels = 10;
  lodPrec.rule = 8;
  for (curX_1 = 0; curX_1 < 4; curX_1 = curX_1 + 1) {
    for (curY_1 = 0; curY_1 < 4; curY_1 = curY_1 + 1) {
      curW_1 = iVar2 * curY_1;
      curH_1 = iVar3 * curX_1;
      local_958 = iVar2;
      if (curY_1 == 3) {
        local_958 = viewport.x - curW_1;
      }
      cellNdx_1 = local_958;
      local_95c = iVar3;
      if (curX_1 == 3) {
        local_95c = viewport.y - curH_1;
      }
      local_30c = local_95c;
      local_310 = curY_1 + curX_1 * 4;
      getBasicTexCoord3D((vector<float,_std::allocator<float>_> *)&sampleParams.baseLevel,local_310)
      ;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                (this,local_16c,(ulong)local_310);
      tcu::SurfaceAccess::SurfaceAccess
                (&local_330,(Surface *)&errorMask.m_pixels.m_cap,format,curW_1,curH_1,cellNdx_1,
                 local_30c);
      TVar12 = tcu::Texture3D::operator_cast_to_Texture3DView(this_00);
      local_340.m_levels = TVar12.m_levels;
      local_340.m_numLevels = TVar12.m_numLevels;
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&sampleParams.baseLevel,0);
      glu::TextureTestUtil::sampleTexture(&local_330,&local_340,pvVar9,(ReferenceParams *)local_16c)
      ;
      tcu::Surface::getAccess
                (&local_390,
                 (Surface *)
                 &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      tcu::getSubregion((PixelBufferAccess *)&local_368,&local_390,curW_1,curH_1,cellNdx_1,local_30c
                       );
      tcu::Surface::getAccess(&local_3e0,(Surface *)&errorMask.m_pixels.m_cap);
      tcu::getSubregion((PixelBufferAccess *)&local_3b8,&local_3e0,curW_1,curH_1,cellNdx_1,local_30c
                       );
      tcu::Surface::getAccess(&local_430,(Surface *)&lookupPrec.colorMask);
      tcu::getSubregion(&local_408,&local_430,curW_1,curH_1,cellNdx_1,local_30c);
      this_02 = glu::Texture3D::getRefTexture(this->m_texture);
      TVar12 = tcu::Texture3D::operator_cast_to_Texture3DView(this_02);
      local_440.m_levels = TVar12.m_levels;
      local_440.m_numLevels = TVar12.m_numLevels;
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&sampleParams.baseLevel,0);
      watchDog = tcu::TestContext::getWatchDog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      iVar4 = glu::TextureTestUtil::computeTextureLookupDiff
                        (&local_368,&local_3b8,&local_408,&local_440,pvVar9,
                         (ReferenceParams *)local_16c,(LookupPrecision *)&lodPrec.derivateBits,
                         (LodPrecision *)local_284,watchDog);
      local_288 = iVar4 + local_288;
    }
  }
  if (0 < local_288) {
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_5c0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_5c0,(char (*) [41])"ERROR: Image verification failed, found ");
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_288);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [17])" invalid pixels!");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_5c0);
  }
  pTVar10 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_620,"Result",&local_621);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,"Verification result",&local_649);
  tcu::LogImageSet::LogImageSet(&local_600,&local_620,&local_648);
  pTVar10 = tcu::TestLog::operator<<(pTVar10,&local_600);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_700,"Rendered",&local_701);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,"Rendered image",&local_729);
  tcu::LogImage::LogImage
            (&local_6e0,&local_700,&local_728,
             (Surface *)
             &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(pTVar10,&local_6e0);
  tcu::LogImage::~LogImage(&local_6e0);
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator(&local_729);
  std::__cxx11::string::~string((string *)&local_700);
  std::allocator<char>::~allocator(&local_701);
  tcu::LogImageSet::~LogImageSet(&local_600);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator(&local_649);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator(&local_621);
  if (0 < local_288) {
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e0,"Reference",&local_7e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_808,"Ideal reference",&local_809);
    tcu::LogImage::LogImage
              (&local_7c0,&local_7e0,&local_808,(Surface *)&errorMask.m_pixels.m_cap,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar10 = tcu::TestLog::operator<<(pTVar10,&local_7c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c0,"ErrorMask",&local_8c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_8e8,"Error mask",&local_8e9);
    tcu::LogImage::LogImage
              (&local_8a0,&local_8c0,(string *)local_8e8,(Surface *)&lookupPrec.colorMask,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(pTVar10,&local_8a0);
    tcu::LogImage::~LogImage(&local_8a0);
    std::__cxx11::string::~string((string *)local_8e8);
    std::allocator<char>::~allocator(&local_8e9);
    std::__cxx11::string::~string((string *)&local_8c0);
    std::allocator<char>::~allocator(&local_8c1);
    tcu::LogImage::~LogImage(&local_7c0);
    std::__cxx11::string::~string((string *)&local_808);
    std::allocator<char>::~allocator(&local_809);
    std::__cxx11::string::~string((string *)&local_7e0);
    std::allocator<char>::~allocator(&local_7e1);
  }
  pTVar10 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(pTVar10,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  pcVar8 = "Image verification failed";
  if (local_288 == 0) {
    pcVar8 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~(local_288 == 0) & QP_TEST_RESULT_FAIL,pcVar8);
  tcu::Surface::~Surface((Surface *)&lookupPrec.colorMask);
  tcu::Surface::~Surface((Surface *)&errorMask.m_pixels.m_cap);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&sampleParams.baseLevel);
  tcu::Surface::~Surface
            ((Surface *)
             &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return STOP;
}

Assistant:

Texture3DLodControlCase::IterateResult Texture3DLodControlCase::iterate (void)
{
	const glw::Functions&			gl					= m_context.getRenderContext().getFunctions();

	const deUint32					wrapS				= GL_CLAMP_TO_EDGE;
	const deUint32					wrapT				= GL_CLAMP_TO_EDGE;
	const deUint32					wrapR				= GL_CLAMP_TO_EDGE;
	const deUint32					magFilter			= GL_NEAREST;
	const tcu::Texture3D&			refTexture			= m_texture->getRefTexture();
	const tcu::TextureFormat&		texFmt				= refTexture.getFormat();
	const tcu::TextureFormatInfo	fmtInfo				= tcu::getTextureFormatInfo(texFmt);
	const int						texWidth			= refTexture.getWidth();
	const int						texHeight			= refTexture.getHeight();

	const tcu::RenderTarget&		renderTarget		= m_context.getRenderContext().getRenderTarget();
	const RandomViewport			viewport			(renderTarget, texWidth*4, texHeight*4, deStringHash(getName()));

	// Viewport is divided into 4x4 grid.
	const int						gridWidth			= 4;
	const int						gridHeight			= 4;
	const int						cellWidth			= viewport.width / gridWidth;
	const int						cellHeight			= viewport.height / gridHeight;

	tcu::Surface					renderedFrame		(viewport.width, viewport.height);
	vector<float>					texCoord;
	ReferenceParams					sampleParams		(TEXTURETYPE_3D);

	// Sampling parameters.
	sampleParams.sampler		= glu::mapGLSampler(wrapS, wrapT, wrapR, m_minFilter, magFilter);
	sampleParams.samplerType	= getSamplerType(texFmt);
	sampleParams.colorBias		= fmtInfo.lookupBias;
	sampleParams.colorScale		= fmtInfo.lookupScale;

	// Bind texture and setup sampler parameters.
	gl.bindTexture	(GL_TEXTURE_3D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_S,		wrapS);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_T,		wrapT);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_R,		wrapR);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			int		curX		= cellWidth*gridX;
			int		curY		= cellHeight*gridY;
			int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
			int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
			int		cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			getBasicTexCoord3D(texCoord, cellNdx);

			setTextureParams(cellNdx);

			// Render with GL.
			gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
			m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		}
	}

	// Read result.
	glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log
	{
		const tcu::PixelFormat&	pixelFormat		= m_context.getRenderTarget().getPixelFormat();
		const bool				isTrilinear		= m_minFilter == GL_NEAREST_MIPMAP_LINEAR || m_minFilter == GL_LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewport.width, viewport.height);
		tcu::Surface			errorMask		(viewport.width, viewport.height);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_OPENGL);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 20);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 16); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int		curX		= cellWidth*gridX;
				const int		curY		= cellHeight*gridY;
				const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
				const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
				const int		cellNdx		= gridY*gridWidth + gridX;

				getBasicTexCoord3D(texCoord, cellNdx);
				getReferenceParams(sampleParams, cellNdx);

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  refTexture, &texCoord[0], sampleParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getRefTexture(), &texCoord[0], sampleParams,
															lookupPrec, lodPrec, m_testCtx.getWatchDog());
			}
		}

		if (numFailedPixels > 0)
			m_testCtx.getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Verification result")
							<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_testCtx.getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
								<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_testCtx.getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image verification failed");
		}
	}

	return STOP;
}